

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool flatbuffers::anon_unknown_1::LoadFileRaw(char *name,bool binary,string *buf)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  ifstream ifs;
  ostringstream oss;
  long *local_3b8 [2];
  long local_3a8 [2];
  undefined1 local_398 [24];
  uint local_380;
  byte abStack_378 [488];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  iVar2 = stat(name,(stat *)local_398);
  if ((iVar2 == 0) && ((local_380 & 0x4000) != 0)) {
    bVar3 = false;
  }
  else {
    std::ifstream::ifstream(local_398,name,(uint)!binary * 4 + _S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      bVar3 = false;
    }
    else {
      if (binary) {
        std::istream::seekg((long)local_398,_S_beg);
        cVar1 = std::istream::tellg();
        std::__cxx11::string::resize((ulong)buf,cVar1);
        std::istream::seekg((long)local_398,_S_beg);
        std::istream::read(local_398,(long)(buf->_M_dataplus)._M_p);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::ostream::operator<<((ostream *)local_190,(streambuf *)(local_398 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)buf,(string *)local_3b8);
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_190);
        std::ios_base::~ios_base(local_120);
      }
      bVar3 = (abStack_378[*(long *)(local_398._0_8_ - 0x18)] & 1) == 0;
    }
    std::ifstream::~ifstream(local_398);
  }
  return bVar3;
}

Assistant:

static bool LoadFileRaw(const char *name, bool binary, std::string *buf) {
  if (DirExists(name)) return false;
  std::ifstream ifs(name, binary ? std::ifstream::binary : std::ifstream::in);
  if (!ifs.is_open()) return false;
  if (binary) {
    // The fastest way to read a file into a string.
    ifs.seekg(0, std::ios::end);
    auto size = ifs.tellg();
    (*buf).resize(static_cast<size_t>(size));
    ifs.seekg(0, std::ios::beg);
    ifs.read(&(*buf)[0], (*buf).size());
  } else {
    // This is slower, but works correctly on all platforms for text files.
    std::ostringstream oss;
    oss << ifs.rdbuf();
    *buf = oss.str();
  }
  return !ifs.bad();
}